

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

void dg::llvmdg::LLVMSlicer::reconnectBBlock(LLVMBBlock *BB,BasicBlock *llvmBB)

{
  StringRef RHS;
  bool bVar1;
  size_t sVar2;
  IntegerType *pIVar3;
  Type *pTVar4;
  reference pBVar5;
  BasicBlock *in_RSI;
  BBlock<dg::LLVMNode> *in_RDI;
  BasicBlock *llvmSucc;
  Value *val;
  BBlockEdge *succ_1;
  iterator __end2;
  iterator __begin2;
  SuccContainerT *__range2;
  BasicBlock *succ;
  BBlockEdge *edge;
  bool create_return;
  Function *F;
  LLVMContext *Ctx;
  Instruction *tinst;
  BasicBlock *in_stack_ffffffffffffff58;
  StringRef *in_stack_ffffffffffffff60;
  LLVMContext *InsertAtEnd;
  Value *in_stack_ffffffffffffff68;
  StringRef *in_stack_ffffffffffffff70;
  _Self local_80;
  _Self local_78;
  SuccContainerT *local_70;
  undefined1 local_58 [16];
  ret_type local_48;
  _Base_ptr local_40;
  reference local_38;
  byte local_29;
  ret_type local_28;
  LLVMContext *local_20;
  Instruction *local_18;
  BasicBlock *local_10;
  BBlock<dg::LLVMNode> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = llvm::BasicBlock::getTerminator((BasicBlock *)0x1d5e14);
  if (local_18 == (Instruction *)0x0) {
    local_20 = (LLVMContext *)llvm::BasicBlock::getContext();
    llvm::BasicBlock::getParent(local_10);
    local_28 = llvm::cast<llvm::Function,llvm::Function>((Function *)0x1d5e55);
    local_29 = 1;
    sVar2 = BBlock<dg::LLVMNode>::successorsNum((BBlock<dg::LLVMNode> *)0x1d5e6f);
    if (sVar2 == 1) {
      BBlock<dg::LLVMNode>::successors(local_8);
      local_40 = (_Base_ptr)
                 DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                           ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                            in_stack_ffffffffffffff58);
      local_38 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                           ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                            0x1d5e99);
      if (local_38->label != 0xff) {
        local_29 = 0;
        BBlock<dg::LLVMNode>::getKey(local_38->target);
        local_48 = llvm::cast<llvm::BasicBlock,llvm::Value>((Value *)0x1d5ec8);
        llvm::BranchInst::Create((BasicBlock *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    if ((local_29 & 1) != 0) {
      sVar2 = BBlock<dg::LLVMNode>::successorsNum((BBlock<dg::LLVMNode> *)0x1d5ef9);
      if (sVar2 != 0) {
        abort();
      }
      llvm::Function::getReturnType((Function *)0x1d5f11);
      bVar1 = llvm::Type::isVoidTy((Type *)0x1d5f19);
      if (bVar1) {
        llvm::ReturnInst::Create((LLVMContext *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
        ;
      }
      else {
        local_58 = llvm::Value::getName();
        llvm::StringRef::StringRef(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
        RHS.Length = (size_t)in_stack_ffffffffffffff70;
        RHS.Data = (char *)in_stack_ffffffffffffff68;
        bVar1 = llvm::StringRef::equals(in_stack_ffffffffffffff60,RHS);
        if (bVar1) {
          InsertAtEnd = local_20;
          pIVar3 = (IntegerType *)llvm::Type::getInt32Ty(local_20);
          llvm::ConstantInt::get(pIVar3,0,false);
          llvm::ReturnInst::Create
                    ((LLVMContext *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (BasicBlock *)InsertAtEnd);
        }
        else {
          pTVar4 = llvm::Function::getReturnType((Function *)0x1d5fd3);
          llvm::UndefValue::get(pTVar4);
          llvm::ReturnInst::Create
                    ((LLVMContext *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (BasicBlock *)in_stack_ffffffffffffff60);
        }
      }
    }
  }
  else {
    local_70 = BBlock<dg::LLVMNode>::successors(local_8);
    local_78._M_node =
         (_Base_ptr)
         DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                   ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    in_stack_ffffffffffffff58);
    local_80._M_node =
         (_Base_ptr)
         DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                   ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    in_stack_ffffffffffffff58);
    while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
      pBVar5 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                         ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)0x1d6047)
      ;
      if (pBVar5->label != 0xff) {
        BBlock<dg::LLVMNode>::getKey(pBVar5->target);
        llvm::cast<llvm::BasicBlock,llvm::Value>((Value *)0x1d607d);
        llvm::Instruction::setSuccessor((uint)local_18,(BasicBlock *)(ulong)pBVar5->label);
      }
      std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++
                ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                 in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

static void reconnectBBlock(LLVMBBlock *BB, llvm::BasicBlock *llvmBB) {
        using namespace llvm;

        auto *tinst = llvmBB->getTerminator();
        assert((!tinst || BB->successorsNum() <= 2 ||
                llvm::isa<llvm::SwitchInst>(tinst)) &&
               "BB has more than two successors (and it's not a switch)");

        if (!tinst) {
            // block has no terminator
            // It may occur for example if we have:
            //
            //   call error()
            //   br %exit
            //
            //  The br instruction has no meaning when error() abort,
            //  but if error is not marked as noreturn, then the br
            //  will be there and will get sliced, making the block
            //  unterminated. The same may happen if we remove unconditional
            //  branch inst

            LLVMContext &Ctx = llvmBB->getContext();
            Function *F = cast<Function>(llvmBB->getParent());
            bool create_return = true;

            if (BB->successorsNum() == 1) {
                const LLVMBBlock::BBlockEdge &edge =
                        *(BB->successors().begin());
                if (edge.label != LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL) {
                    // don't create return, we created branchinst
                    create_return = false;

                    BasicBlock *succ = cast<BasicBlock>(edge.target->getKey());
                    BranchInst::Create(succ, llvmBB);
                }
            }

            if (create_return) {
                if (BB->successorsNum() != 0) {
                    assert(BB->successorsNum() == 0 &&
                           "Creating return to BBlock that has successors");
                    abort();
                }

                if (F->getReturnType()->isVoidTy())
                    ReturnInst::Create(Ctx, llvmBB);
                else if (F->getName().equals("main"))
                    // if this is main, than the safe exit equals to returning 0
                    // (it is just for convenience, we wouldn't need to do this)
                    ReturnInst::Create(
                            Ctx, ConstantInt::get(Type::getInt32Ty(Ctx), 0),
                            llvmBB);
                else
                    ReturnInst::Create(Ctx, UndefValue::get(F->getReturnType()),
                                       llvmBB);
            }

            // and that is all we can do here
            return;
        }

        for (const LLVMBBlock::BBlockEdge &succ : BB->successors()) {
            // skip artificial return basic block
            if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL)
                continue;

            llvm::Value *val = succ.target->getKey();
            assert(val && "nullptr as BB's key");
            llvm::BasicBlock *llvmSucc = llvm::cast<llvm::BasicBlock>(val);
            tinst->setSuccessor(succ.label, llvmSucc);
        }

        // if the block still does not have terminator
    }